

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvwriter.cc
# Opt level: O2

int32 __thiscall mkvmuxer::MkvWriter::Position(MkvWriter *this,int64 position)

{
  int iVar1;
  
  if ((FILE *)this->file_ != (FILE *)0x0) {
    iVar1 = fseeko((FILE *)this->file_,position,0);
    return iVar1;
  }
  return -1;
}

Assistant:

int32 MkvWriter::Position(int64 position) {
  if (!file_)
    return -1;

#ifdef _MSC_VER
  return _fseeki64(file_, position, SEEK_SET);
#elif defined(_WIN32)
  return fseeko64(file_, static_cast<off_t>(position), SEEK_SET);
#elif !(defined(__ANDROID__) && __ANDROID_API__ < 24 && !defined(__LP64__) && \
        defined(_FILE_OFFSET_BITS) && _FILE_OFFSET_BITS == 64)
  // POSIX.1 has fseeko and ftello. fseeko and ftello are not available before
  // Android API level 24. See
  // https://android.googlesource.com/platform/bionic/+/main/docs/32-bit-abi.md
  return fseeko(file_, static_cast<off_t>(position), SEEK_SET);
#else
  return fseek(file_, static_cast<long>(position), SEEK_SET);
#endif
}